

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like.cpp
# Opt level: O1

bool duckdb::TemplatedLikeOperator<(char)37,(char)95,false,duckdb::StandardCharacterReader>
               (char *sdata,idx_t slen,char *pdata,idx_t plen,char escape)

{
  ulong uVar1;
  char cVar2;
  bool bVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  idx_t slen_00;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  
  bVar10 = plen == 0;
  if (slen == 0 || bVar10) {
    uVar9 = 0;
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    uVar8 = 0;
    do {
      cVar2 = pdata[uVar7];
      if (cVar2 == '_') {
        uVar9 = uVar8 + 1;
        if (uVar8 + 1 < slen) {
          uVar9 = slen;
        }
        bVar3 = true;
        if (uVar8 + 1 < slen) {
          uVar9 = uVar8 + 1;
        }
      }
      else {
        uVar9 = uVar8;
        if (cVar2 == '%') {
          uVar5 = uVar7 + 1;
          uVar6 = uVar7;
          if (uVar7 + 1 < plen) {
            uVar5 = plen;
          }
          do {
            uVar1 = uVar6 + 1;
            uVar7 = uVar5;
            if (plen <= uVar1) break;
            lVar4 = uVar6 + 1;
            uVar6 = uVar1;
            uVar7 = uVar1;
          } while (pdata[lVar4] == '%');
          if (plen - uVar7 == 0) {
            bVar10 = true;
            bVar3 = false;
          }
          else {
            slen_00 = slen - uVar8;
            if (slen < uVar8 || slen_00 == 0) goto LAB_011240fc;
            do {
              bVar10 = TemplatedLikeOperator<(char)37,(char)95,false,duckdb::StandardCharacterReader>
                                 (sdata + uVar8,slen_00,pdata + uVar7,plen - uVar7,escape);
              uVar9 = uVar8;
              if (bVar10) break;
              uVar8 = uVar8 + 1;
              slen_00 = slen_00 - 1;
              uVar9 = slen;
            } while (slen_00 != 0);
            bVar3 = false;
          }
        }
        else if (cVar2 == sdata[uVar8]) {
          bVar3 = true;
          uVar9 = uVar8 + 1;
        }
        else {
LAB_011240fc:
          bVar10 = false;
          bVar3 = false;
        }
      }
      if (!bVar3) {
        return bVar10;
      }
      uVar7 = uVar7 + 1;
    } while ((uVar7 < plen) && (uVar8 = uVar9, uVar9 < slen));
  }
  uVar8 = uVar7;
  if (uVar7 < plen) {
    do {
      uVar8 = uVar7;
      if (pdata[uVar7] != '%') break;
      uVar7 = uVar7 + 1;
      uVar8 = plen;
    } while (plen != uVar7);
  }
  return uVar9 == slen && uVar8 == plen;
}

Assistant:

bool TemplatedLikeOperator(const char *sdata, idx_t slen, const char *pdata, idx_t plen, char escape) {
	idx_t pidx = 0;
	idx_t sidx = 0;
	for (; pidx < plen && sidx < slen; pidx++) {
		char pchar = READER::Operation(pdata, pidx);
		char schar = READER::Operation(sdata, sidx);
		if (HAS_ESCAPE && pchar == escape) {
			pidx++;
			if (pidx == plen) {
				throw SyntaxException("Like pattern must not end with escape character!");
			}
			if (pdata[pidx] != schar) {
				return false;
			}
			sidx++;
		} else if (pchar == UNDERSCORE) {
			READER::NextCharacter(sdata, slen, sidx);
		} else if (pchar == PERCENTAGE) {
			pidx++;
			while (pidx < plen && pdata[pidx] == PERCENTAGE) {
				pidx++;
			}
			if (pidx == plen) {
				return true; /* tail is acceptable */
			}
			for (; sidx < slen; sidx++) {
				if (TemplatedLikeOperator<PERCENTAGE, UNDERSCORE, HAS_ESCAPE, READER>(
				        sdata + sidx, slen - sidx, pdata + pidx, plen - pidx, escape)) {
					return true;
				}
			}
			return false;
		} else if (pchar == schar) {
			sidx++;
		} else {
			return false;
		}
	}
	while (pidx < plen && pdata[pidx] == PERCENTAGE) {
		pidx++;
	}
	return pidx == plen && sidx == slen;
}